

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O1

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,int numViewports)

{
  VkBool32 *this;
  ostringstream *this_00;
  VkAttachmentStoreOp *pVVar1;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  undefined8 buffer;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int i;
  deUint32 queueFamilyIndex;
  VkResult result;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vk_00;
  VkDevice device;
  Allocator *pAVar9;
  TextureFormat format;
  DeviceInterface *pDVar10;
  VkDevice pVVar11;
  const_iterator cVar12;
  VkQueue queue;
  NotSupportedError *this_01;
  float fVar13;
  float fVar14;
  pointer pVVar15;
  VkDeviceSize bufferSize;
  long lVar16;
  int iVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  ConstPixelBufferAccess resultImage;
  VkAttachmentDescription colorAttachmentDescription;
  undefined4 uStack_804;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> scissors;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> rectScissors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexColors;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_740;
  VkPhysicalDeviceFeatures features;
  Move<vk::Handle<(vk::HandleType)18>_> local_5a8;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> viewports;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_500;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  Vec4 clearColor;
  Vec4 colors [16];
  VkShaderModule local_3b8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3b0;
  VkRenderPass local_398;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_390;
  VkFramebuffer local_378;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_370;
  VkPipelineLayout local_358;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_350;
  VkPipeline local_338;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_330;
  VkCommandPool local_318;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_310;
  deUint32 local_2f8;
  deUint32 dStack_2f4;
  deUint32 dStack_2f0;
  deUint32 dStack_2ec;
  deUint32 local_2e8;
  deUint32 dStack_2e4;
  deUint32 dStack_2e0;
  deUint32 dStack_2dc;
  uint local_27c;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkAttachmentReference colorAttachmentRef;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [1];
  VkViewport defaultViewport;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures(&features,vk,physicalDevice);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)colors,vk,physicalDevice);
  if (features.geometryShader == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Required feature is not supported: geometryShader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x179);
LAB_007f1bd8:
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (features.multiViewport == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Required feature is not supported: multiViewport",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17c);
    goto LAB_007f1bd8;
  }
  if (local_27c < 0x10) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Implementation doesn\'t support minimum required number of viewports",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17f);
    goto LAB_007f1bd8;
  }
  vk_00 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pAVar9 = Context::getDefaultAllocator(context);
  clearColor.m_data[0] = 0.5;
  clearColor.m_data[1] = 0.5;
  clearColor.m_data[2] = 0.5;
  clearColor.m_data[3] = 1.0;
  colors[0].m_data[0] = 0.18;
  colors[0].m_data[1] = 0.42;
  colors[0].m_data[2] = 0.17;
  colors[0].m_data[3] = 1.0;
  colors[1].m_data[0] = 0.29;
  colors[1].m_data[1] = 0.62;
  colors[1].m_data[2] = 0.28;
  colors[1].m_data[3] = 1.0;
  colors[2].m_data[0] = 0.59;
  colors[2].m_data[1] = 0.84;
  colors[2].m_data[2] = 0.44;
  colors[2].m_data[3] = 1.0;
  colors[3].m_data[0] = 0.96;
  colors[3].m_data[1] = 0.95;
  colors[3].m_data[2] = 0.72;
  colors[3].m_data[3] = 1.0;
  colors[4].m_data[0] = 0.94;
  colors[4].m_data[1] = 0.55;
  colors[4].m_data[2] = 0.39;
  colors[4].m_data[3] = 1.0;
  colors[5].m_data[0] = 0.82;
  colors[5].m_data[1] = 0.19;
  colors[5].m_data[2] = 0.12;
  colors[5].m_data[3] = 1.0;
  colors[6].m_data[0] = 0.46;
  colors[6].m_data[1] = 0.15;
  colors[6].m_data[2] = 0.26;
  colors[6].m_data[3] = 1.0;
  colors[7].m_data[0] = 0.24;
  colors[7].m_data[1] = 0.14;
  colors[7].m_data[2] = 0.24;
  colors[7].m_data[3] = 1.0;
  colors[8].m_data[0] = 0.49;
  colors[8].m_data[1] = 0.31;
  colors[8].m_data[2] = 0.26;
  colors[8].m_data[3] = 1.0;
  colors[9].m_data[0] = 0.78;
  colors[9].m_data[1] = 0.52;
  colors[9].m_data[2] = 0.33;
  colors[9].m_data[3] = 1.0;
  colors[10].m_data[0] = 0.94;
  colors[10].m_data[1] = 0.82;
  colors[10].m_data[2] = 0.31;
  colors[10].m_data[3] = 1.0;
  colors[0xb].m_data[0] = 0.98;
  colors[0xb].m_data[1] = 0.65;
  colors[0xb].m_data[2] = 0.3;
  colors[0xb].m_data[3] = 1.0;
  colors[0xc].m_data[0] = 0.22;
  colors[0xc].m_data[1] = 0.65;
  colors[0xc].m_data[2] = 0.53;
  colors[0xc].m_data[3] = 1.0;
  colors[0xd].m_data[0] = 0.67;
  colors[0xd].m_data[1] = 0.81;
  colors[0xd].m_data[2] = 0.91;
  colors[0xd].m_data[3] = 1.0;
  colors[0xe].m_data[0] = 0.43;
  colors[0xe].m_data[1] = 0.44;
  colors[0xe].m_data[2] = 0.75;
  colors[0xe].m_data[3] = 1.0;
  colors[0xf].m_data[0] = 0.26;
  colors[0xf].m_data[1] = 0.24;
  colors[0xf].m_data[2] = 0.48;
  colors[0xf].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  vector<tcu::Vector<float,4>const*,void>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertexColors,
             colors,colors + numViewports,(allocator_type *)&features);
  fVar20 = (float)numViewports;
  if (fVar20 < 0.0) {
    fVar21 = sqrtf(fVar20);
  }
  else {
    fVar21 = SQRT(fVar20);
  }
  fVar21 = ceilf(fVar21);
  fVar20 = ceilf(fVar20 / (float)(int)fVar21);
  scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::reserve
            (&scissors,(long)numViewports);
  if (0 < numViewports) {
    iVar17 = 0;
    fVar14 = 0.0;
    fVar13 = 0.0;
    do {
      colors[0].m_data[3] = (float)(0x80 / (long)(int)fVar20);
      fVar19 = 0.0;
      if (iVar17 != 0 && iVar17 % (int)fVar21 == 0) {
        fVar13 = 0.0;
        fVar19 = colors[0].m_data[3];
      }
      fVar14 = (float)((int)fVar14 + (int)fVar19);
      colors[0].m_data[1] = fVar14;
      colors[0].m_data[0] = fVar13;
      fVar19 = (float)(0x80 / (long)(int)fVar21);
      colors[0].m_data[2] = fVar19;
      std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
      emplace_back<tcu::Vector<int,4>>
                ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)&scissors,
                 (Vector<int,_4> *)colors);
      fVar13 = (float)((int)fVar13 + (int)fVar19);
      iVar17 = iVar17 + 1;
    } while (numViewports != iVar17);
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar17 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar17 << 0xe);
  makeBufferCreateInfo((VkBufferCreateInfo *)colors,bufferSize,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&features,vk_00,device,
                     (VkBufferCreateInfo *)colors,(VkAllocationCallbacks *)0x0);
  buffer = features._0_8_;
  DStack_500.m_device = (VkDevice)features._16_8_;
  DStack_500.m_deviceIface = (DeviceInterface *)features._8_8_;
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)colors,vk_00,device,
             pAVar9,(VkBuffer)buffer,(MemoryRequirement)0x1);
  uVar5 = colors[0].m_data._0_8_;
  memset(*(void **)(colors[0].m_data._0_8_ + 0x18),0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk_00,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),*(VkDeviceSize *)(uVar5 + 0x10),
             bufferSize);
  features._0_8_ = context->m_testCtx->m_log;
  this = &features.imageCubeArray;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Rendering a colorful grid of ",0x1d);
  std::ostream::operator<<(this,numViewports);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," rectangle(s).",0xe);
  colors[0].m_data._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&features,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = (ostringstream *)(colors[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Not covered area will be filled with a gray color.",0x32);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)colors,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(colors[7].m_data + 2));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&features.shaderStorageImageMultisample);
  colors[0].m_data[0] = 1.79366e-43;
  colors[0].m_data[1] = 1.79366e-43;
  colors[0].m_data[2] = 5.1848e-44;
  colors[0].m_data[3] = 1.4013e-45;
  colors[1].m_data[0] = 0.0;
  colors[1].m_data[1] = 1.4013e-45;
  colors[1].m_data[2] = 0.0;
  colors[1].m_data[3] = 1.4013e-45;
  colors[2].m_data[0] = clearColor.m_data[0];
  colors[2].m_data[1] = clearColor.m_data[1];
  colors[2].m_data[2] = clearColor.m_data[2];
  colors[2].m_data[3] = clearColor.m_data[3];
  colors[3].m_data._8_8_ =
       (long)vertexColors.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)vertexColors.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  colors[3].m_data[0] = (float)numViewports;
  colors[4].m_data[0] = 0.0;
  colors[4].m_data[1] = 0.0;
  colors[4].m_data[2] = 0.0;
  colors[4].m_data[3] = 0.0;
  colors[5].m_data[0] = 0.0;
  colors[5].m_data[1] = 0.0;
  colors[5].m_data[2] = 0.0;
  colors[5].m_data[3] = 0.0;
  colors[6].m_data[0] = 0.0;
  colors[6].m_data[1] = 0.0;
  colors[7].m_data[0] = 0.0;
  colors[7].m_data[1] = 0.0;
  colors[7].m_data[2] = 0.0;
  colors[7].m_data[3] = 0.0;
  colors[8].m_data[0] = 0.0;
  colors[8].m_data[1] = 0.0;
  colors[8].m_data[2] = 0.0;
  colors[8].m_data[3] = 0.0;
  colors[9].m_data[0] = 0.0;
  colors[9].m_data[1] = 0.0;
  colors[9].m_data[2] = 0.0;
  colors[9].m_data[3] = 0.0;
  colors[10].m_data[0] = 0.0;
  colors[10].m_data[1] = 0.0;
  colors[10].m_data[2] = 0.0;
  colors[10].m_data[3] = 0.0;
  colors[0xb].m_data[0] = 0.0;
  colors[0xb].m_data[1] = 0.0;
  memset(colors + 0xc,0,0x120);
  pDVar10 = Context::getDeviceInterface(context);
  pVVar11 = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pAVar9 = Context::getDefaultAllocator(context);
  features.robustBufferAccess = 0xe;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.geometryShader = 0;
  features.tessellationShader = 1;
  features.sampleRateShading = (VkBool32)colors[0].m_data[2];
  features.dualSrcBlend = (VkBool32)colors[0].m_data._0_8_;
  features.logicOp = SUB84(colors[0].m_data._0_8_,4);
  features.multiDrawIndirect = 1;
  features.drawIndirectFirstInstance = 1;
  features.depthClamp = 1;
  features.depthBiasClamp = 1;
  features.fillModeNonSolid = 0;
  features.depthBounds = 0x11;
  features.wideLines = 0;
  features.largePoints = 0;
  features.multiViewport = 0;
  features.samplerAnisotropy = 0;
  features._80_8_ = (ulong)features.textureCompressionASTC_LDR << 0x20;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&colorAttachmentDescription,pDVar10,
                    pVVar11,(VkImageCreateInfo *)&features,(VkAllocationCallbacks *)0x0);
  resultImage.m_size.m_data[2] = colorAttachmentDescription.storeOp;
  resultImage.m_pitch.m_data[0] = colorAttachmentDescription.stencilLoadOp;
  resultImage.m_pitch.m_data[1] = colorAttachmentDescription.stencilStoreOp;
  resultImage.m_pitch.m_data[2] = colorAttachmentDescription.initialLayout;
  resultImage.m_format.order = colorAttachmentDescription.flags;
  resultImage.m_format.type = colorAttachmentDescription.format;
  resultImage.m_size.m_data[0] = colorAttachmentDescription.samples;
  resultImage.m_size.m_data[1] = colorAttachmentDescription.loadOp;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (colors[4].m_data._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(colors[4].m_data + 2),
               (VkImage)colors[4].m_data._0_8_);
  }
  colors[5].m_data[0] = (float)resultImage.m_size.m_data[2];
  colors[5].m_data[1] = (float)resultImage.m_pitch.m_data[0];
  colors[5].m_data[2] = (float)resultImage.m_pitch.m_data[1];
  colors[5].m_data[3] = (float)resultImage.m_pitch.m_data[2];
  colors[4].m_data[0] = (float)resultImage.m_format.order;
  colors[4].m_data[1] = (float)resultImage.m_format.type;
  colors[4].m_data[2] = (float)resultImage.m_size.m_data[0];
  colors[4].m_data[3] = (float)resultImage.m_size.m_data[1];
  if (colorAttachmentDescription._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&colorAttachmentDescription.samples,
               (VkImage)colorAttachmentDescription._0_8_);
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar10,
            pVVar11,pAVar9,(VkImage)colors[4].m_data._0_8_,(MemoryRequirement)0x0);
  uVar2 = features._0_8_;
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  if (colors[6].m_data._0_8_ != uVar2) {
    if (colors[6].m_data._0_8_ != 0) {
      (**(code **)(*(long *)colors[6].m_data._0_8_ + 8))();
    }
    uVar3 = features._0_8_;
    features.robustBufferAccess = (VkBool32)uVar2;
    features.fullDrawIndexUint32 = SUB84(uVar2,4);
    colors[6].m_data[0] = (float)features.robustBufferAccess;
    colors[6].m_data[1] = (float)features.fullDrawIndexUint32;
    features._0_8_ = uVar3;
  }
  if (features._0_8_ != 0) {
    (**(code **)(*(long *)features._0_8_ + 8))();
    features.robustBufferAccess = 0;
    features.fullDrawIndexUint32 = 0;
  }
  local_4e8 = CONCAT44(colors[1].m_data[0],colors[0].m_data[3]);
  uStack_4e0 = CONCAT44(colors[1].m_data[2],colors[1].m_data[1]);
  local_4d8 = colors[1].m_data[3];
  subresourceRange.baseMipLevel = (deUint32)colors[1].m_data[0];
  subresourceRange.aspectMask = (VkImageAspectFlags)colors[0].m_data[3];
  subresourceRange.levelCount = (deUint32)colors[1].m_data[1];
  subresourceRange.baseArrayLayer = (deUint32)colors[1].m_data[2];
  subresourceRange.layerCount = (deUint32)colors[1].m_data[3];
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImage,pDVar10,pVVar11,
                (VkImage)colors[4].m_data._0_8_,VK_IMAGE_VIEW_TYPE_2D,(VkFormat)colors[0].m_data[2],
                subresourceRange);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (colors[7].m_data._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(colors[7].m_data + 2),
               (VkImageView)colors[7].m_data._0_8_);
  }
  colors[8].m_data[3] = (float)features.dualSrcBlend;
  colors[8].m_data[2] = (float)features.sampleRateShading;
  colors[8].m_data[0] = (float)features.geometryShader;
  colors[8].m_data[1] = (float)features.tessellationShader;
  colors[7].m_data[0] = (float)features.robustBufferAccess;
  colors[7].m_data[1] = (float)features.fullDrawIndexUint32;
  colors[7].m_data[2] = (float)features.imageCubeArray;
  colors[7].m_data[3] = (float)features.independentBlend;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&resultImage.m_size,
               (VkImageView)resultImage.m_format);
  }
  makeBufferCreateInfo((VkBufferCreateInfo *)&features,colors[3].m_data._8_8_,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&colorAttachmentDescription,pDVar10,
                     pVVar11,(VkBufferCreateInfo *)&features,(VkAllocationCallbacks *)0x0);
  resultImage.m_size.m_data[2] = colorAttachmentDescription.storeOp;
  resultImage.m_pitch.m_data[0] = colorAttachmentDescription.stencilLoadOp;
  resultImage.m_pitch.m_data[1] = colorAttachmentDescription.stencilStoreOp;
  resultImage.m_pitch.m_data[2] = colorAttachmentDescription.initialLayout;
  resultImage.m_format.order = colorAttachmentDescription.flags;
  resultImage.m_format.type = colorAttachmentDescription.format;
  resultImage.m_size.m_data[0] = colorAttachmentDescription.samples;
  resultImage.m_size.m_data[1] = colorAttachmentDescription.loadOp;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (colors[9].m_data._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(colors[9].m_data + 2),
               (VkBuffer)colors[9].m_data._0_8_);
  }
  colors[10].m_data[0] = (float)resultImage.m_size.m_data[2];
  colors[10].m_data[1] = (float)resultImage.m_pitch.m_data[0];
  colors[10].m_data[2] = (float)resultImage.m_pitch.m_data[1];
  colors[10].m_data[3] = (float)resultImage.m_pitch.m_data[2];
  colors[9].m_data[0] = (float)resultImage.m_format.order;
  colors[9].m_data[1] = (float)resultImage.m_format.type;
  colors[9].m_data[2] = (float)resultImage.m_size.m_data[0];
  colors[9].m_data[3] = (float)resultImage.m_size.m_data[1];
  if (colorAttachmentDescription._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&colorAttachmentDescription.samples,
               (VkBuffer)colorAttachmentDescription._0_8_);
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar10,
             pVVar11,pAVar9,(VkBuffer)colors[9].m_data._0_8_,(MemoryRequirement)0x1);
  uVar2 = features._0_8_;
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  if (colors[0xb].m_data._0_8_ != uVar2) {
    if (colors[0xb].m_data._0_8_ != 0) {
      (**(code **)(*(long *)colors[0xb].m_data._0_8_ + 8))();
    }
    uVar3 = features._0_8_;
    features.robustBufferAccess = (VkBool32)uVar2;
    features.fullDrawIndexUint32 = SUB84(uVar2,4);
    colors[0xb].m_data[0] = (float)features.robustBufferAccess;
    colors[0xb].m_data[1] = (float)features.fullDrawIndexUint32;
    features._0_8_ = uVar3;
  }
  if (features._0_8_ != 0) {
    (**(code **)(*(long *)features._0_8_ + 8))();
    features.robustBufferAccess = 0;
    features.fullDrawIndexUint32 = 0;
  }
  memcpy(*(void **)(colors[0xb].m_data._0_8_ + 0x18),
         vertexColors.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,colors[3].m_data._8_8_);
  ::vk::flushMappedMemoryRange
            (pDVar10,pVVar11,(VkDeviceMemory)*(deUint64 *)(colors[0xb].m_data._0_8_ + 8),
             *(VkDeviceSize *)(colors[0xb].m_data._0_8_ + 0x10),colors[3].m_data._8_8_);
  pVVar1 = &colorAttachmentDescription.storeOp;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_4_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription._16_5_ = 0x74726576;
  colorAttachmentDescription._0_8_ = pVVar1;
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)context->m_progCollection,(key_type *)&colorAttachmentDescription);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar10,pVVar11,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (colors[0xc].m_data._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(colors[0xc].m_data + 2),
               (VkShaderModule)colors[0xc].m_data._0_8_);
  }
  colors[0xd].m_data[3] = (float)features.dualSrcBlend;
  colors[0xd].m_data[2] = (float)features.sampleRateShading;
  colors[0xd].m_data[0] = (float)features.geometryShader;
  colors[0xd].m_data[1] = (float)features.tessellationShader;
  colors[0xc].m_data[0] = (float)features.robustBufferAccess;
  colors[0xc].m_data[1] = (float)features.fullDrawIndexUint32;
  colors[0xc].m_data[2] = (float)features.imageCubeArray;
  colors[0xc].m_data[3] = (float)features.independentBlend;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
               (VkShaderModule)resultImage.m_format);
  }
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar1) {
    operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1);
  }
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_4_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription._16_5_ = 0x6d6f6567;
  colorAttachmentDescription._0_8_ = pVVar1;
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)context->m_progCollection,(key_type *)&colorAttachmentDescription);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar10,pVVar11,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (colors[0xe].m_data._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(colors[0xe].m_data + 2),
               (VkShaderModule)colors[0xe].m_data._0_8_);
  }
  colors[0xf].m_data[3] = (float)features.dualSrcBlend;
  colors[0xf].m_data[2] = (float)features.sampleRateShading;
  colors[0xf].m_data[0] = (float)features.geometryShader;
  colors[0xf].m_data[1] = (float)features.tessellationShader;
  colors[0xe].m_data[0] = (float)features.robustBufferAccess;
  colors[0xe].m_data[1] = (float)features.fullDrawIndexUint32;
  colors[0xe].m_data[2] = (float)features.imageCubeArray;
  colors[0xe].m_data[3] = (float)features.independentBlend;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
               (VkShaderModule)resultImage.m_format);
  }
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar1) {
    operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1);
  }
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_4_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription._16_5_ = 0x67617266;
  colorAttachmentDescription._0_8_ = pVVar1;
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)context->m_progCollection,(key_type *)&colorAttachmentDescription);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar10,pVVar11,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (local_3b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3b0,local_3b8);
  }
  uVar2 = features._0_8_;
  DStack_3b0.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_3b0.m_device = (VkDevice)features._16_8_;
  DStack_3b0.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&resultImage.m_size,
               (VkShaderModule)resultImage.m_format);
  }
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar1) {
    operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1);
  }
  colorAttachmentDescription._0_8_ = (ulong)(uint)colors[0].m_data[2] << 0x20;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  stack0xfffffffffffff7f8 = CONCAT44(uStack_804,2);
  features._32_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  features.geometryShader = 0;
  features.tessellationShader = 0;
  features.dualSrcBlend = 0;
  features.drawIndirectFirstInstance = 0;
  features.depthClamp = 0;
  features.largePoints = 0;
  features.alphaToOne = 0;
  features.depthBiasClamp = 0;
  features.fillModeNonSolid = 0;
  features.depthBounds = 0;
  features.wideLines = 0;
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.sampleRateShading = 1;
  resultImage.m_format.order = 0x26;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 1;
  resultImage.m_data = (void *)CONCAT44(resultImage.m_data._4_4_,1);
  resultImage.m_pitch.m_data._4_8_ = &colorAttachmentDescription;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,pDVar10,
             pVVar11,(VkRenderPassCreateInfo *)&resultImage,(VkAllocationCallbacks *)0x0);
  features.geometryShader = pipelineRasterizationStateInfo.flags;
  features.tessellationShader = pipelineRasterizationStateInfo.depthClampEnable;
  features.sampleRateShading = pipelineRasterizationStateInfo.rasterizerDiscardEnable;
  features.dualSrcBlend = pipelineRasterizationStateInfo.polygonMode;
  features.robustBufferAccess = pipelineRasterizationStateInfo.sType;
  features.fullDrawIndexUint32 = pipelineRasterizationStateInfo._4_4_;
  features._8_8_ = pipelineRasterizationStateInfo.pNext;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.pNext = (void *)0x0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  if (local_398.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_390,local_398);
  }
  DStack_390.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_390.m_device = (VkDevice)features._16_8_;
  local_398.m_internal._0_4_ = features.robustBufferAccess;
  local_398.m_internal._4_4_ = features.fullDrawIndexUint32;
  DStack_390.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (pipelineRasterizationStateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo.pNext,
               (VkRenderPass)pipelineRasterizationStateInfo._0_8_);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&resultImage,pDVar10,pVVar11,local_398,1,
                  (VkImageView *)(colors + 7),(deUint32)(float)colors[0].m_data._0_8_,
                  (deUint32)colors[0].m_data[1],1);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (local_378.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_370,local_378);
  }
  DStack_370.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_370.m_device = (VkDevice)features._16_8_;
  local_378.m_internal._0_4_ = features.robustBufferAccess;
  local_378.m_internal._4_4_ = features.fullDrawIndexUint32;
  DStack_370.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&resultImage.m_size,
               (VkFramebuffer)resultImage.m_format);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImage,pDVar10,pVVar11);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_350,local_358);
  }
  DStack_350.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_350.m_device = (VkDevice)features._16_8_;
  local_358.m_internal._0_4_ = features.robustBufferAccess;
  local_358.m_internal._4_4_ = features.fullDrawIndexUint32;
  DStack_350.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&resultImage.m_size,
               (VkPipelineLayout)resultImage.m_format);
  }
  uVar6 = colors[0xe].m_data._0_8_;
  uVar3 = colors[0xc].m_data._0_8_;
  fVar20 = colors[0].m_data[0];
  fVar21 = colors[0].m_data[1];
  fVar13 = colors[3].m_data[0];
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&local_740,&scissors);
  vertexInputStateInfo.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x10;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputStateInfo.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 1;
  defaultViewport.width = (float)(int)fVar20;
  defaultViewport.height = (float)(int)fVar21;
  vertexInputStateInfo.vertexAttributeDescriptionCount = 1;
  defaultViewport.x = 0.0;
  defaultViewport.y = 0.0;
  defaultViewport.minDepth = 0.0;
  defaultViewport.maxDepth = 1.0;
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            (&viewports,(long)(int)fVar13,&defaultViewport,(allocator_type *)&features);
  rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::reserve(&rectScissors,(long)(int)fVar13)
  ;
  if (local_740.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_740.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar15 = local_740.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      features.robustBufferAccess = pVVar15->m_data[0];
      features.fullDrawIndexUint32 = pVVar15->m_data[1];
      features._8_8_ = *(VkExtent2D *)(pVVar15->m_data + 2);
      if (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::
        _M_realloc_insert<vk::VkRect2D_const&>
                  ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&rectScissors,
                   (iterator)
                   rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(VkRect2D *)&features);
      }
      else {
        (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
         super__Vector_impl_data._M_finish)->offset = (VkOffset2D)features._0_8_;
        (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
         super__Vector_impl_data._M_finish)->extent = (VkExtent2D)features._8_8_;
        rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
        super__Vector_impl_data._M_finish =
             rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pVVar15 = pVVar15 + 1;
    } while (pVVar15 !=
             local_740.
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  uVar7 = colors[0xe].m_data._0_8_;
  pipelineRasterizationStateInfo.pNext = (void *)0x0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  colorAttachmentDescription.flags = 0x19;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_GENERAL;
  stack0xfffffffffffff7f8 = 0;
  colorAttachmentRef.attachment = 0x1a;
  features.robustBufferAccess = 0x12;
  uVar4 = features._0_8_;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.geometryShader = 0;
  features.tessellationShader = 1;
  features.sampleRateShading = (VkBool32)uVar3;
  features.dualSrcBlend = SUB84(uVar3,4);
  features.logicOp = 0xaed455;
  features.multiDrawIndirect = 0;
  features.drawIndirectFirstInstance = 0;
  features.depthClamp = 0;
  features.depthBiasClamp = 0x12;
  features.depthBounds = 0;
  features.wideLines = 0;
  features.largePoints = 0;
  features.alphaToOne = 8;
  colors[0xe].m_data[0] = (float)uVar6;
  colors[0xe].m_data[1] = SUB84(uVar6,4);
  features.multiViewport = (VkBool32)colors[0xe].m_data[0];
  features.samplerAnisotropy = (VkBool32)colors[0xe].m_data[1];
  features._80_8_ = (long)"pre_main" + 4;
  features.textureCompressionBC = 0;
  features.occlusionQueryPrecise = 0;
  features.pipelineStatisticsQuery = 0x12;
  features.fragmentStoresAndAtomics = 0;
  features.shaderTessellationAndGeometryPointSize = 0;
  features.shaderImageGatherExtended = 0;
  features.shaderStorageImageExtendedFormats = 0x10;
  features.robustBufferAccess = (VkBool32)uVar2;
  features.fullDrawIndexUint32 = SUB84(uVar2,4);
  features.shaderStorageImageMultisample = features.robustBufferAccess;
  features.shaderStorageImageReadWithoutFormat = features.fullDrawIndexUint32;
  features._128_8_ = (long)"pre_main" + 4;
  resultImage.m_format.order = sBGR|sR;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 3;
  resultImage.m_pitch.m_data._4_8_ = &features;
  resultImage.m_data = &vertexInputStateInfo;
  features.shaderSampledImageArrayDynamicIndexing = 0;
  features.shaderStorageBufferArrayDynamicIndexing = 0;
  features._0_8_ = uVar4;
  colors[0xe].m_data._0_8_ = uVar7;
  ::vk::createGraphicsPipeline
            (&local_5a8,pDVar10,pVVar11,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&resultImage,(VkAllocationCallbacks *)0x0);
  if (rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)rectScissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)rectScissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (viewports.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(viewports.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  features._16_8_ = local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device
  ;
  features.sampleRateShading =
       (VkBool32)local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
  ;
  features.dualSrcBlend =
       (VkBool32)
       ((ulong)local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
       >> 0x20);
  features.robustBufferAccess =
       (undefined4)local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  features.fullDrawIndexUint32 =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal._4_4_;
  features._8_8_ =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_330,local_338);
  }
  DStack_330.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_330.m_device = (VkDevice)features._16_8_;
  local_338.m_internal._0_4_ = features.robustBufferAccess;
  local_338.m_internal._4_4_ = features.fullDrawIndexUint32;
  DStack_330.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_740.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_740.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_740.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_740.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImage,pDVar10,pVVar11,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (local_318.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_310,local_318);
  }
  DStack_310.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
  DStack_310.m_device = (VkDevice)features._16_8_;
  local_318.m_internal._0_4_ = features.robustBufferAccess;
  local_318.m_internal._4_4_ = features.fullDrawIndexUint32;
  DStack_310.m_deviceIface = (DeviceInterface *)features._8_8_;
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&resultImage.m_size,
               (VkCommandPool)resultImage.m_format);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultImage,pDVar10,pVVar11,local_318,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  features.geometryShader = resultImage.m_size.m_data[2];
  features.tessellationShader = resultImage.m_pitch.m_data[0];
  features.sampleRateShading = resultImage.m_pitch.m_data[1];
  features.dualSrcBlend = resultImage.m_pitch.m_data[2];
  features.robustBufferAccess = resultImage.m_format.order;
  features.fullDrawIndexUint32 = resultImage.m_format.type;
  features.imageCubeArray = resultImage.m_size.m_data[0];
  features.independentBlend = resultImage.m_size.m_data[1];
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (CONCAT44(dStack_2f4,local_2f8) != 0) {
    colorAttachmentDescription._0_8_ = CONCAT44(dStack_2f4,local_2f8);
    (**(code **)(*(long *)CONCAT44(dStack_2ec,dStack_2f0) + 0x240))
              ((long *)CONCAT44(dStack_2ec,dStack_2f0),CONCAT44(dStack_2e4,local_2e8),
               CONCAT44(dStack_2dc,dStack_2e0));
  }
  local_2e8 = features.geometryShader;
  dStack_2e4 = features.tessellationShader;
  dStack_2e0 = features.sampleRateShading;
  dStack_2dc = features.dualSrcBlend;
  local_2f8 = features.robustBufferAccess;
  dStack_2f4 = features.fullDrawIndexUint32;
  dStack_2f0 = features.imageCubeArray;
  dStack_2ec = features.independentBlend;
  if (resultImage.m_format != (TextureFormat)0x0) {
    features.robustBufferAccess = resultImage.m_format.order;
    features.fullDrawIndexUint32 = resultImage.m_format.type;
    (**(code **)(*(long *)resultImage.m_size.m_data._0_8_ + 0x240))
              (resultImage.m_size.m_data._0_8_,resultImage._16_8_,resultImage.m_pitch.m_data._4_8_);
  }
  pDVar10 = Context::getDeviceInterface(context);
  pVVar11 = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  beginCommandBuffer(pDVar10,(VkCommandBuffer)CONCAT44(dStack_2f4,local_2f8));
  colorAttachmentDescription.flags = (VkAttachmentDescriptionFlags)colors[2].m_data[0];
  colorAttachmentDescription.format = (VkFormat)colors[2].m_data[1];
  colorAttachmentDescription.samples = (VkSampleCountFlagBits)colors[2].m_data[2];
  colorAttachmentDescription.loadOp = (VkAttachmentLoadOp)colors[2].m_data[3];
  resultImage.m_format.order = 0x2b;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = (undefined4)local_398.m_internal;
  resultImage.m_pitch.m_data[0] = local_398.m_internal._4_4_;
  resultImage.m_pitch.m_data[1] = (undefined4)local_378.m_internal;
  resultImage.m_pitch.m_data[2] = local_378.m_internal._4_4_;
  resultImage.m_data = (void *)0x0;
  (*pDVar10->_vptr_DeviceInterface[0x74])(pDVar10,CONCAT44(dStack_2f4,local_2f8),&resultImage,0);
  (*pDVar10->_vptr_DeviceInterface[0x4c])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),0,local_338.m_internal);
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  (*pDVar10->_vptr_DeviceInterface[0x58])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),0,1,colors + 9,&features);
  (*pDVar10->_vptr_DeviceInterface[0x59])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),colors[3].m_data._0_8_ & 0xffffffff,1,0,0);
  (*pDVar10->_vptr_DeviceInterface[0x76])(pDVar10,CONCAT44(dStack_2f4,local_2f8));
  features.robustBufferAccess = 0x2d;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.geometryShader = 0x100;
  features.tessellationShader = 0x800;
  features.sampleRateShading = 2;
  features.dualSrcBlend = 6;
  features.logicOp = 0xffffffff;
  features.multiDrawIndirect = 0xffffffff;
  features.drawIndirectFirstInstance = (VkBool32)colors[4].m_data._0_8_;
  features.depthClamp = SUB84(colors[4].m_data._0_8_,4);
  features.depthBiasClamp = (VkBool32)colors[0].m_data[3];
  features.fillModeNonSolid = (VkBool32)colors[1].m_data[0];
  features.depthBounds = (VkBool32)colors[1].m_data[1];
  features.wideLines = (VkBool32)colors[1].m_data[2];
  features.largePoints = (VkBool32)colors[1].m_data[3];
  uVar22 = SUB84(&features,0);
  (*pDVar10->_vptr_DeviceInterface[0x6d])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),0x400,0x1000,0,0,0,0,0,1,uVar22);
  features.robustBufferAccess = 0;
  features.fullDrawIndexUint32 = 0;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.geometryShader = 1;
  features.tessellationShader = 0;
  features.sampleRateShading = 0;
  features.dualSrcBlend = 1;
  features.logicOp = 0;
  features.multiDrawIndirect = 0;
  features.drawIndirectFirstInstance = 0;
  features.depthClamp = (VkBool32)colors[0].m_data._0_8_;
  features.depthBiasClamp = SUB84(colors[0].m_data._0_8_,4);
  features.fillModeNonSolid = 1;
  (*pDVar10->_vptr_DeviceInterface[99])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),colors[4].m_data._0_8_,6,buffer,1,uVar22);
  features.robustBufferAccess = 0x2c;
  features.imageCubeArray = 0;
  features.independentBlend = 0;
  features.geometryShader = 0x1000;
  features.tessellationShader = 0x2000;
  features.sampleRateShading = 0xffffffff;
  features.dualSrcBlend = 0xffffffff;
  features.logicOp = (VkBool32)buffer;
  features.multiDrawIndirect = SUB84(buffer,4);
  features.drawIndirectFirstInstance = 0;
  features.depthClamp = 0;
  features.depthBiasClamp = 0xffffffff;
  features.fillModeNonSolid = 0xffffffff;
  (*pDVar10->_vptr_DeviceInterface[0x6d])
            (pDVar10,CONCAT44(dStack_2f4,local_2f8),0x1000,0x4000,0,0,0,1,uVar22,0,0);
  result = (*pDVar10->_vptr_DeviceInterface[0x4a])(pDVar10,CONCAT44(dStack_2f4,local_2f8));
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
                    ,0x2ac);
  submitCommandsAndWait(pDVar10,pVVar11,queue,(VkCommandBuffer)CONCAT44(dStack_2f4,local_2f8));
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)colors);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),0,bufferSize);
  colors[0].m_data._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultImage,(TextureFormat *)colors,0x80,0x80,1,*(void **)(uVar5 + 0x18));
  pipelineRasterizationStateInfo._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&colorAttachmentDescription,
             (TextureFormat *)&pipelineRasterizationStateInfo,0x80,0x80,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)colors,(TextureLevel *)&colorAttachmentDescription);
  tcu::clear((PixelBufferAccess *)colors,&clearColor);
  if (scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar16 = 0;
    uVar18 = 0;
    do {
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&features,(TextureLevel *)&colorAttachmentDescription);
      tcu::getSubregion((PixelBufferAccess *)colors,(PixelBufferAccess *)&features,
                        *(int *)((long)(scissors.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16)
                        ,*(int *)((long)(scissors.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                 lVar16 + 4),
                        *(int *)((long)(scissors.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar16 + 8),
                        *(int *)((long)(scissors.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar16 + 0xc));
      tcu::clear((PixelBufferAccess *)colors,
                 (Vec4 *)((long)(vertexColors.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16));
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar18 < (ulong)((long)scissors.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)scissors.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  log = context->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((ConstPixelBufferAccess *)colors,(TextureLevel *)&colorAttachmentDescription);
  lVar16 = 0;
  do {
    (&features.robustBufferAccess)[lVar16] = 0x3ca3d70a;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  bVar8 = tcu::floatThresholdCompare
                    (log,"color","Image compare",(ConstPixelBufferAccess *)colors,&resultImage,
                     (Vec4 *)&features,COMPARE_LOG_RESULT);
  if (bVar8) {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&colorAttachmentDescription);
  }
  else {
    colors[0].m_data._0_8_ = colors + 1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)colors,"Rendered image is not correct","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,colors[0].m_data._0_8_,
               CONCAT44(colors[0].m_data[3],colors[0].m_data[2]) + colors[0].m_data._0_8_);
    if ((Vec4 *)colors[0].m_data._0_8_ != colors + 1) {
      operator_delete((void *)colors[0].m_data._0_8_,
                      CONCAT44(colors[1].m_data[1],colors[1].m_data[0]) + 1);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&colorAttachmentDescription);
    if (!bVar8) goto LAB_007f1ad5;
  }
  colors[0].m_data._0_8_ = colors + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)colors,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,colors[0].m_data._0_8_,
             CONCAT44(colors[0].m_data[3],colors[0].m_data[2]) + colors[0].m_data._0_8_);
  if ((Vec4 *)colors[0].m_data._0_8_ != colors + 1) {
    operator_delete((void *)colors[0].m_data._0_8_,
                    CONCAT44(colors[1].m_data[1],colors[1].m_data[0]) + 1);
  }
LAB_007f1ad5:
  if (uVar5 != 0) {
    (**(code **)(*(long *)uVar5 + 8))();
  }
  if (buffer != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_500,(VkBuffer)buffer);
  }
  if (scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(scissors.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)scissors.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)scissors.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vertexColors.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertexColors.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertexColors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertexColors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const int numViewports)
{
	requireFeatureMultiViewport(context.getInstanceInterface(), context.getPhysicalDevice());

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec2						renderSize			(128, 128);
	const VkFormat					colorFormat			= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						clearColor			(0.5f, 0.5f, 0.5f, 1.0f);
	const std::vector<Vec4>			vertexColors		= generateColors(numViewports);
	const std::vector<IVec4>		scissors			= generateScissors(numViewports, renderSize);

	const VkDeviceSize				colorBufferSize		= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Rendering a colorful grid of " << numViewports << " rectangle(s)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Not covered area will be filled with a gray color." << tcu::TestLog::EndMessage;
	}

	// Draw
	{
		const ScissorRenderer renderer (context, renderSize, numViewports, scissors, colorFormat, clearColor, vertexColors);
		renderer.draw(context, *colorBuffer);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferAlloc->getHostPtr());
		const tcu::TextureLevel				referenceImage	= generateReferenceImage(mapVkFormat(colorFormat), renderSize, clearColor, scissors, vertexColors);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage.getAccess(), resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}